

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

bool tchecker::zg::shared_is_le(state_t *s1,state_t *s2)

{
  bool bVar1;
  zone_t *this;
  zone_t *zone;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_> local_20;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_> local_18;
  
  bVar1 = ta::shared_equal_to(&s1->super_state_t,&s2->super_state_t);
  if (bVar1) {
    state_t::zone_ptr((state_t *)&local_18);
    state_t::zone_ptr((state_t *)&local_20);
    if (local_18._t == (make_shared_t<tchecker::intval_t,_unsigned_long,_1UL> *)local_20._t) {
      bVar1 = true;
    }
    else {
      this = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
              ::operator*(&s1->_zone)->super_zone_t;
      zone = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
              ::operator*(&s2->_zone)->super_zone_t;
      bVar1 = zone_t::operator<=(this,zone);
    }
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                *)&local_20);
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                *)&local_18);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool shared_is_le(tchecker::zg::state_t const & s1, tchecker::zg::state_t const & s2)
{
  return tchecker::ta::shared_equal_to(s1, s2) && (s1.zone_ptr() == s2.zone_ptr() || s1.zone() <= s2.zone());
}